

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

ParsedIR * __thiscall spirv_cross::ParsedIR::operator=(ParsedIR *this,ParsedIR *other)

{
  bool bVar1;
  int local_1c;
  int i;
  ParsedIR *other_local;
  ParsedIR *this_local;
  
  if (this != other) {
    ::std::
    unique_ptr<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>::
    operator=(&this->pool_group,&other->pool_group);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&this->spirv,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&other->spirv);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
    ::operator=(&this->meta,&other->meta);
    for (local_1c = 0; local_1c < 0xe; local_1c = local_1c + 1) {
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
                (this->ids_for_type + local_1c,other->ids_for_type + local_1c);
    }
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_undef_or_type,&other->ids_for_constant_undef_or_type);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::operator=
              (&this->ids_for_constant_or_variable,&other->ids_for_constant_or_variable);
    SmallVector<spv::Capability,_8UL>::operator=
              (&this->declared_capabilities,&other->declared_capabilities);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::operator=(&this->declared_extensions,&other->declared_extensions);
    SmallVector<unsigned_char,_8UL>::operator=(&this->block_meta,&other->block_meta);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>_>
    ::operator=(&this->continue_block_to_loop_header,&other->continue_block_to_loop_header);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
    ::operator=(&this->entry_points,&other->entry_points);
    SmallVector<spirv_cross::Variant,_8UL>::operator=(&this->ids,&other->ids);
    this->addressing_model = other->addressing_model;
    this->memory_model = other->memory_model;
    (this->default_entry_point).id = (other->default_entry_point).id;
    (this->source).version = (other->source).version;
    bVar1 = (other->source).known;
    (this->source).es = (other->source).es;
    (this->source).known = bVar1;
    (this->source).hlsl = (other->source).hlsl;
    this->loop_iteration_depth_hard = other->loop_iteration_depth_hard;
    this->loop_iteration_depth_soft = other->loop_iteration_depth_soft;
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::operator=(&this->meta_needing_name_fixup,&other->meta_needing_name_fixup);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_unsigned_int>_>_>
    ::operator=(&this->load_type_width,&other->load_type_width);
  }
  return this;
}

Assistant:

ParsedIR &ParsedIR::operator=(ParsedIR &&other) SPIRV_CROSS_NOEXCEPT
{
	if (this != &other)
	{
		pool_group = std::move(other.pool_group);
		spirv = std::move(other.spirv);
		meta = std::move(other.meta);
		for (int i = 0; i < TypeCount; i++)
			ids_for_type[i] = std::move(other.ids_for_type[i]);
		ids_for_constant_undef_or_type = std::move(other.ids_for_constant_undef_or_type);
		ids_for_constant_or_variable = std::move(other.ids_for_constant_or_variable);
		declared_capabilities = std::move(other.declared_capabilities);
		declared_extensions = std::move(other.declared_extensions);
		block_meta = std::move(other.block_meta);
		continue_block_to_loop_header = std::move(other.continue_block_to_loop_header);
		entry_points = std::move(other.entry_points);
		ids = std::move(other.ids);
		addressing_model = other.addressing_model;
		memory_model = other.memory_model;

		default_entry_point = other.default_entry_point;
		source = other.source;
		loop_iteration_depth_hard = other.loop_iteration_depth_hard;
		loop_iteration_depth_soft = other.loop_iteration_depth_soft;

		meta_needing_name_fixup = std::move(other.meta_needing_name_fixup);
		load_type_width = std::move(other.load_type_width);
	}
	return *this;
}